

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClockingAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ClockingAssertionExpr,slang::ast::TimingControl&,slang::ast::AssertionExpr_const&>
          (BumpAllocator *this,TimingControl *args,AssertionExpr *args_1)

{
  ClockingAssertionExpr *expr;
  TimingControl *in_RDX;
  ClockingAssertionExpr *in_RSI;
  BumpAllocator *in_RDI;
  
  expr = (ClockingAssertionExpr *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  slang::ast::ClockingAssertionExpr::ClockingAssertionExpr(in_RSI,in_RDX,(AssertionExpr *)expr);
  return expr;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }